

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JsonReporter::testCaseStarting(JsonReporter *this,TestCaseInfo *tcInfo)

{
  StringRef *pSVar1;
  TestCaseProperties TVar2;
  _Elt_pointer pJVar3;
  Tag *tag;
  StringRef *value;
  StringRef key;
  JsonArrayWriter JStack_218;
  JsonObjectWriter testInfo;
  StringRef local_1e8;
  JsonArrayWriter local_1d8;
  JsonValueWriter local_1c0;
  
  (this->super_StreamingReporterBase).currentTestCaseInfo = tcInfo;
  startObject(this);
  pJVar3 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar3 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar3 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c0,(int)pJVar3 + -0x18,"test-info",9);
  JsonValueWriter::writeObject(&testInfo,&local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c0,(int)&testInfo,"name",4);
  JsonValueWriter::write<std::__cxx11::string>(&local_1c0,&tcInfo->name);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0.m_sstream);
  anon_unknown_26::writeSourceInfo(&testInfo,&tcInfo->lineInfo);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c0,(int)&testInfo,"tags",4);
  JsonValueWriter::writeArray(&local_1d8,&local_1c0);
  pSVar1 = &((tcInfo->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
             super__Vector_impl_data._M_finish)->original;
  for (value = &((tcInfo->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                 super__Vector_impl_data._M_start)->original; value != pSVar1; value = value + 1) {
    JsonArrayWriter::writeImpl<Catch::StringRef>(&local_1d8,value);
  }
  JsonArrayWriter::~JsonArrayWriter(&local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c0,(int)&testInfo,"properties",10);
  JsonValueWriter::writeArray(&JStack_218,&local_1c0);
  TVar2 = tcInfo->properties;
  if ((TVar2 & IsHidden) != None) {
    local_1e8.m_start = "is-hidden";
    local_1e8.m_size = 9;
    JsonArrayWriter::writeImpl<Catch::StringRef>(&JStack_218,&local_1e8);
    TVar2 = tcInfo->properties;
  }
  if ((TVar2 & (MayFail|ShouldFail)) != None) {
    local_1e8.m_start = "ok-to-fail";
    local_1e8.m_size = 10;
    JsonArrayWriter::writeImpl<Catch::StringRef>(&JStack_218,&local_1e8);
    TVar2 = tcInfo->properties;
  }
  if ((TVar2 & ShouldFail) != None) {
    local_1e8.m_start = "expected-to-fail";
    local_1e8.m_size = 0x10;
    JsonArrayWriter::writeImpl<Catch::StringRef>(&JStack_218,&local_1e8);
    TVar2 = tcInfo->properties;
  }
  if ((TVar2 & Throws) != None) {
    local_1e8.m_start = "throws";
    local_1e8.m_size = 6;
    JsonArrayWriter::writeImpl<Catch::StringRef>(&JStack_218,&local_1e8);
  }
  JsonArrayWriter::~JsonArrayWriter(&JStack_218);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0.m_sstream);
  JsonObjectWriter::~JsonObjectWriter(&testInfo);
  key.m_size = 4;
  key.m_start = "runs";
  startArray(this,key);
  return;
}

Assistant:

void JsonReporter::testCaseStarting( TestCaseInfo const& tcInfo ) {
        StreamingReporterBase::testCaseStarting( tcInfo );

        assert( isInside( Writer::Array ) &&
                "We should be in the 'test-cases' array" );
        startObject();
        // "test-info" prelude
        {
            auto testInfo =
                m_objectWriters.top().write( "test-info"_sr ).writeObject();
            // TODO: handle testName vs className!!
            testInfo.write( "name"_sr ).write( tcInfo.name );
            writeSourceInfo(testInfo, tcInfo.lineInfo);
            writeTags( testInfo.write( "tags"_sr ).writeArray(), tcInfo.tags );
            writeProperties( testInfo.write( "properties"_sr ).writeArray(),
                             tcInfo );
        }


        // Start the array for individual test runs (testCasePartial pairs)
        startArray( "runs"_sr );
    }